

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.h
# Opt level: O2

int fy_parse_peek_at(fy_parser *fyp,int pos)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  size_t offset;
  ulong uVar4;
  
  offset = 0;
  uVar4 = (ulong)(uint)pos;
  if (pos < 1) {
    uVar4 = offset;
  }
  while( true ) {
    uVar1 = fy_parse_peek_at_offset(fyp,offset);
    iVar3 = (int)uVar4;
    uVar4 = (ulong)(iVar3 - 1);
    if ((iVar3 == 0) || ((int)uVar1 < 0)) break;
    lVar2 = 1;
    if ((0x7f < uVar1) && (lVar2 = 2, 0x7ff < uVar1)) {
      lVar2 = 4 - (ulong)(uVar1 < 0x10000);
    }
    offset = offset + lVar2;
  }
  return uVar1;
}

Assistant:

static inline int fy_parse_peek_at(struct fy_parser *fyp, int pos) {
    return fy_parse_peek_at_internal(fyp, pos, NULL);
}